

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O3

size_t gc_onestep(lua_State *L)

{
  GCSize *pGVar1;
  undefined8 *puVar2;
  uint uVar3;
  global_State *g;
  GCSize GVar4;
  long lVar5;
  ulong uVar6;
  byte bVar7;
  int iVar8;
  GCRef *pGVar9;
  size_t sVar10;
  size_t sVar11;
  GCtab *t;
  uint64_t uVar12;
  GCobj *pGVar13;
  cTValue *o;
  GCobj *o_00;
  uint uVar14;
  long lVar15;
  undefined1 *puVar16;
  ulong uVar17;
  
  g = (global_State *)(L->glref).ptr64;
  switch((g->gc).state) {
  case '\0':
    (g->gc).gray.gcptr64 = 0;
    (g->gc).grayagain.gcptr64 = 0;
    (g->gc).weak.gcptr64 = 0;
    pGVar13 = (GCobj *)(g->mainthref).gcptr64;
    if (((pGVar13->gch).marked & 3) != 0) {
      gc_mark(g,pGVar13);
      pGVar13 = (GCobj *)(g->mainthref).gcptr64;
    }
    pGVar13 = (GCobj *)(pGVar13->th).env.gcptr64;
    if (((pGVar13->gch).marked & 3) != 0) {
      gc_mark(g,pGVar13);
    }
    if ((((int)(g->registrytv).field_4.it >> 0xf) + 0xdU < 9) &&
       (pGVar13 = (GCobj *)((ulong)(g->registrytv).field_4 & 0x7fffffffffff),
       ((pGVar13->gch).marked & 3) != 0)) {
      gc_mark(g,pGVar13);
    }
    gc_mark_gcroot(g);
    (g->gc).state = '\x01';
    break;
  case '\x01':
    if ((g->gc).gray.gcptr64 != 0) {
      sVar10 = propagatemark(g);
      return sVar10;
    }
    (g->gc).state = '\x02';
    break;
  case '\x02':
    if ((g->jit_base).ptr64 != 0) {
      return 0x800000000000;
    }
    for (puVar16 = *(undefined1 **)((long)&(g->uvhead).field_5 + 8);
        &g->uvhead != (GCupval *)puVar16; puVar16 = *(undefined1 **)(puVar16 + 0x18)) {
      if ((((puVar16[8] & 7) == 0) && ((int)((long)**(ulong **)(puVar16 + 0x20) >> 0x2f) + 0xdU < 9)
          ) && (pGVar13 = (GCobj *)(**(ulong **)(puVar16 + 0x20) & 0x7fffffffffff),
               ((pGVar13->gch).marked & 3) != 0)) {
        gc_mark(g,pGVar13);
      }
    }
    while ((g->gc).gray.gcptr64 != 0) {
      propagatemark(g);
    }
    (g->gc).gray.gcptr64 = (g->gc).weak.gcptr64;
    (g->gc).weak.gcptr64 = 0;
    if ((L->marked & 3) != 0) {
      gc_mark(g,(GCobj *)L);
    }
    gc_traverse_trace(g,(GCtrace *)(g + 1));
    gc_mark_gcroot(g);
    while ((g->gc).gray.gcptr64 != 0) {
      propagatemark(g);
    }
    uVar12 = (g->gc).grayagain.gcptr64;
    (g->gc).gray.gcptr64 = uVar12;
    (g->gc).grayagain.gcptr64 = 0;
    while (uVar12 != 0) {
      propagatemark(g);
      uVar12 = (g->gc).gray.gcptr64;
    }
    sVar10 = lj_gc_separateudata(g,0);
    pGVar13 = (GCobj *)(g->gc).mmudata.gcptr64;
    o_00 = pGVar13;
    if (pGVar13 != (GCobj *)0x0) {
      do {
        o_00 = *(GCobj **)o_00;
        (o_00->gch).marked = (g->gc).currentwhite & 3 | (o_00->gch).marked & 0xf8;
        gc_mark(g,o_00);
      } while (o_00 != pGVar13);
    }
    if ((g->gc).gray.gcptr64 == 0) {
      lVar15 = 0;
    }
    else {
      lVar15 = 0;
      do {
        sVar11 = propagatemark(g);
        lVar15 = lVar15 + sVar11;
      } while ((g->gc).gray.gcptr64 != 0);
    }
    for (uVar12 = (g->gc).weak.gcptr64; uVar12 != 0; uVar12 = *(uint64_t *)(uVar12 + 0x18)) {
      if (((*(byte *)(uVar12 + 8) & 0x10) != 0) &&
         (uVar3 = *(uint *)(uVar12 + 0x30), (ulong)uVar3 != 0)) {
        uVar17 = 0;
        do {
          lVar5 = *(long *)(uVar12 + 0x10);
          iVar8 = gc_mayclear(*(cTValue **)(lVar5 + uVar17 * 8),1);
          if (iVar8 != 0) {
            *(undefined8 *)(lVar5 + uVar17 * 8) = 0xffffffffffffffff;
          }
          uVar17 = uVar17 + 1;
        } while (uVar3 != uVar17);
      }
      uVar3 = *(uint *)(uVar12 + 0x34);
      if (uVar3 != 0) {
        lVar5 = *(long *)(uVar12 + 0x28);
        uVar17 = 0;
        do {
          o = *(cTValue **)(lVar5 + uVar17 * 0x18);
          if (o != (cTValue *)0xffffffffffffffff) {
            puVar2 = (undefined8 *)(lVar5 + uVar17 * 0x18);
            uVar6 = puVar2[1];
            if ((int)((long)uVar6 >> 0x2f) + 0xdU < 9) {
              bVar7 = *(byte *)((uVar6 & 0x7fffffffffff) + 8);
              if ((long)uVar6 >> 0x2f == -5) {
                *(byte *)((uVar6 & 0x7fffffffffff) + 8) = bVar7 & 0xfc;
                o = (cTValue *)*puVar2;
                goto LAB_00126efa;
              }
              if ((bVar7 & 3) == 0) goto LAB_00126efa;
            }
            else {
LAB_00126efa:
              iVar8 = gc_mayclear(o,1);
              if (iVar8 == 0) goto LAB_00126f10;
            }
            *puVar2 = 0xffffffffffffffff;
          }
LAB_00126f10:
          uVar14 = (int)uVar17 + 1;
          uVar17 = (ulong)uVar14;
        } while (uVar14 <= uVar3);
      }
    }
    lj_buf_shrink(L,&g->tmpbuf);
    bVar7 = (g->gc).currentwhite ^ 3;
    (g->gc).currentwhite = bVar7;
    (g->strempty).marked = bVar7;
    (g->gc).sweep.ptr64 = (uint64_t)&(g->gc).root;
    (g->gc).estimate = (g->gc).total - (lVar15 + sVar10);
    (g->gc).state = '\x03';
    (g->gc).sweepstr = 0;
    break;
  case '\x03':
    GVar4 = (g->gc).total;
    uVar3 = (g->gc).sweepstr;
    (g->gc).sweepstr = uVar3 + 1;
    gc_sweepstr(g,(g->str).tab + uVar3);
    if ((g->str).mask < (g->gc).sweepstr) {
      (g->gc).state = '\x04';
    }
    pGVar1 = &(g->gc).estimate;
    *pGVar1 = *pGVar1 + ((g->gc).total - GVar4);
    return 10;
  case '\x04':
    GVar4 = (g->gc).total;
    pGVar9 = gc_sweep(g,(GCRef *)(g->gc).sweep.ptr64,0x28);
    (g->gc).sweep.ptr64 = (uint64_t)pGVar9;
    pGVar1 = &(g->gc).estimate;
    *pGVar1 = *pGVar1 + ((g->gc).total - GVar4);
    if (pGVar9->gcptr64 != 0) {
      return 400;
    }
    uVar3 = (g->str).mask;
    if ((0x1ff < uVar3) && ((g->str).num <= uVar3 >> 2)) {
      lj_str_resize(L,uVar3 >> 1);
    }
    if ((g->gc).mmudata.gcptr64 == 0) {
      (g->gc).state = '\0';
      (g->gc).debt = 0;
      return 400;
    }
    (g->gc).state = '\x05';
    (g->gc).nocdatafin = '\x01';
    return 400;
  case '\x05':
    if ((g->gc).mmudata.gcptr64 != 0) {
      if ((g->jit_base).ptr64 != 0) {
        return 0x800000000000;
      }
      gc_finalize(L);
      uVar17 = (g->gc).estimate;
      if (100 < uVar17) {
        (g->gc).estimate = uVar17 - 100;
        return 100;
      }
      return 100;
    }
    if ((g->gc).nocdatafin == '\0') {
      lj_tab_rehash(L,*(GCtab **)((g->ctype_state).ptr64 + 0x20));
    }
    (g->gc).state = '\0';
    (g->gc).debt = 0;
  }
  return 0;
}

Assistant:

static size_t gc_onestep(lua_State *L)
{
  global_State *g = G(L);
  switch (g->gc.state) {
  case GCSpause:
    gc_mark_start(g);  /* Start a new GC cycle by marking all GC roots. */
    return 0;
  case GCSpropagate:
    if (gcref(g->gc.gray) != NULL)
      return propagatemark(g);  /* Propagate one gray object. */
    g->gc.state = GCSatomic;  /* End of mark phase. */
    return 0;
  case GCSatomic:
    if (tvref(g->jit_base))  /* Don't run atomic phase on trace. */
      return LJ_MAX_MEM;
    atomic(g, L);
    g->gc.state = GCSsweepstring;  /* Start of sweep phase. */
    g->gc.sweepstr = 0;
    return 0;
  case GCSsweepstring: {
    GCSize old = g->gc.total;
    gc_sweepstr(g, &g->str.tab[g->gc.sweepstr++]);  /* Sweep one chain. */
    if (g->gc.sweepstr > g->str.mask)
      g->gc.state = GCSsweep;  /* All string hash chains sweeped. */
    lj_assertG(old >= g->gc.total, "sweep increased memory");
    g->gc.estimate -= old - g->gc.total;
    return GCSWEEPCOST;
    }
  case GCSsweep: {
    GCSize old = g->gc.total;
    setmref(g->gc.sweep, gc_sweep(g, mref(g->gc.sweep, GCRef), GCSWEEPMAX));
    lj_assertG(old >= g->gc.total, "sweep increased memory");
    g->gc.estimate -= old - g->gc.total;
    if (gcref(*mref(g->gc.sweep, GCRef)) == NULL) {
      if (g->str.num <= (g->str.mask >> 2) && g->str.mask > LJ_MIN_STRTAB*2-1)
	lj_str_resize(L, g->str.mask >> 1);  /* Shrink string table. */
      if (gcref(g->gc.mmudata)) {  /* Need any finalizations? */
	g->gc.state = GCSfinalize;
#if LJ_HASFFI
	g->gc.nocdatafin = 1;
#endif
      } else {  /* Otherwise skip this phase to help the JIT. */
	g->gc.state = GCSpause;  /* End of GC cycle. */
	g->gc.debt = 0;
      }
    }
    return GCSWEEPMAX*GCSWEEPCOST;
    }
  case GCSfinalize:
    if (gcref(g->gc.mmudata) != NULL) {
      if (tvref(g->jit_base))  /* Don't call finalizers on trace. */
	return LJ_MAX_MEM;
      gc_finalize(L);  /* Finalize one userdata object. */
      if (g->gc.estimate > GCFINALIZECOST)
	g->gc.estimate -= GCFINALIZECOST;
      return GCFINALIZECOST;
    }
#if LJ_HASFFI
    if (!g->gc.nocdatafin) lj_tab_rehash(L, ctype_ctsG(g)->finalizer);
#endif
    g->gc.state = GCSpause;  /* End of GC cycle. */
    g->gc.debt = 0;
    return 0;
  default:
    lj_assertG(0, "bad GC state");
    return 0;
  }
}